

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O0

int __thiscall QCalendarWidget::qt_metacall(QCalendarWidget *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  void **in_stack_00000050;
  int in_stack_00000058;
  Call in_stack_0000005c;
  QObject *in_stack_00000060;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QWidget::qt_metacall
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 0x18) {
        qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      }
      iVar1 = iVar1 + -0x18;
    }
    if (in_ESI == 7) {
      if (iVar1 < 0x18) {
        qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      }
      iVar1 = iVar1 + -0x18;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      iVar1 = iVar1 + -0xb;
    }
  }
  return iVar1;
}

Assistant:

int QCalendarWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 11;
    }
    return _id;
}